

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O2

size_t tinyusdz::LZ4Compression::DecompressFromBuffer
                 (char *compressedPtr,char *outputPtr,size_t compressedSize,size_t maxOutputSize,
                 string *err)

{
  byte bVar1;
  int compressedSize_00;
  uint __val;
  uint uVar2;
  ulong uVar3;
  int *source;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((compressedSize < 2) || (bVar1 = *compressedPtr, bVar1 != 0 && maxOutputSize < 0x7e000000)) {
joined_r0x00292fd2:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
  }
  else {
    source = (int *)(compressedPtr + 1);
    if (bVar1 == 0) {
      __val = LZ4_decompress_safe((char *)source,outputPtr,(int)compressedSize + -1,
                                  (int)maxOutputSize);
      if (-1 < (int)__val) {
        return (ulong)__val;
      }
LAB_00292f5d:
      if (err != (string *)0x0) {
        ::std::__cxx11::to_string(&local_90,__val);
        ::std::operator+(&local_70,"Failed to decompress data, possibly corrupt? LZ4 error code: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90);
        ::std::operator+(&local_50,&local_70,"\n");
        ::std::__cxx11::string::operator=((string *)err,(string *)&local_50);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
    }
    else {
      lVar5 = 0;
      uVar2 = (uint)bVar1;
      if ((char)bVar1 < '\x01') {
        uVar2 = 0;
      }
      sVar4 = 0;
      while( true ) {
        if (uVar2 << 2 == (int)lVar5) {
          return sVar4;
        }
        if (compressedSize < lVar5 + 5U) break;
        compressedSize_00 = *source;
        if ((0x7e000000 < (long)compressedSize_00) || (compressedSize_00 < 1)) break;
        uVar3 = 0x7e000000;
        if (maxOutputSize < 0x7e000000) {
          uVar3 = maxOutputSize;
        }
        __val = LZ4_decompress_safe((char *)(source + 1),outputPtr,compressedSize_00,(int)uVar3);
        if ((int)__val < 1) goto LAB_00292f5d;
        uVar3 = (ulong)__val;
        bVar6 = maxOutputSize < uVar3;
        maxOutputSize = maxOutputSize - uVar3;
        if (bVar6) goto joined_r0x00292fd2;
        source = (int *)((long)(source + 1) + (long)compressedSize_00);
        outputPtr = outputPtr + uVar3;
        sVar4 = sVar4 + uVar3;
        lVar5 = lVar5 + 4;
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
    }
  }
  return 0;
}

Assistant:

size_t LZ4Compression::DecompressFromBuffer(char const *compressedPtr,
                                               char *outputPtr,
                                               size_t compressedSize,
                                               size_t maxOutputSize,
                                               std::string *err) {
  if (compressedSize <= 1) {
      if (err) {
        (*err) =
            "Invalid compressedSize.\n";
      }
    return 0;
  }

  // Check first byte for # chunks.
  int nChunks = *compressedPtr++;
  if (nChunks > 127) {
    if (err) {
      (*err) =
          "Too many chunks in LZ4 compressed data.\n";
    }
    return 0;
  }

  DCOUT("compressedSize = " << compressedSize);
  DCOUT("maxOutputSize = " << maxOutputSize);
  DCOUT("nChunks = " << nChunks);
  //std::cout << "compressedSize = " << compressedSize << "\n";
  //std::cout << "maxOutputSize = " << maxOutputSize << "\n";
  //std::cout << "nChunks = " << nChunks << "\n";

  size_t consumedCompressedSize = 1;

  if (maxOutputSize < LZ4_MAX_INPUT_SIZE) {
    // nChunks must be 0 for < LZ4_MAX_INPUT_SIZE
    if (nChunks != 0) {
      if (err) {
        (*err) = "Corrupted LZ4 compressed data.\n";
      }
      return 0;
    }
  }

  if (nChunks == 0) {
    // Just one.
    int nDecompressed = LZ4_decompress_safe(compressedPtr, outputPtr,
                                            int(compressedSize - 1), int(maxOutputSize));
    if (nDecompressed < 0) {
      if (err) {
        (*err) =
            "Failed to decompress data, possibly corrupt? "
            "LZ4 error code: " +
            std::to_string(nDecompressed) + "\n";
      }
      return 0;
    }
    return size_t(nDecompressed);
  } else {
    // Do each chunk.
    size_t totalDecompressed = 0;
    for (int i = 0; i < nChunks; ++i) {
      int32_t chunkSize = 0;
      if (consumedCompressedSize + sizeof(chunkSize) > compressedSize) {
        if (err) {
           (*err) += "Corrupted chunk data.";
        }
        return 0;
          
      }

      memcpy(&chunkSize, compressedPtr, sizeof(chunkSize));

      if (chunkSize > LZ4_MAX_INPUT_SIZE) {
        if (err) {
           (*err) += "ChunkSize exceeds LZ4_MAX_INPUT_SIZE.\n";
        }
        return 0;
      }
      if (chunkSize <= 0) {
        if (err) {
           (*err) += "Invalid ChunkSize.\n";
        }
        return 0;
      }

      DCOUT("chunk[" << i << "] size = " << chunkSize);

      //std::cout << "chunkSize = " << chunkSize << "\n";
      consumedCompressedSize += sizeof(chunkSize);
      //std::cout << "consumedCompressedSize = " << consumedCompressedSize << "\n";
      //std::cout << "compressedSize = " << compressedSize << "\n";
      if (consumedCompressedSize > compressedSize) {
        if (err) {
           (*err) += "Total chunk size exceeds input compressedSize.\n";
        }
        return 0;
      }

      compressedPtr += sizeof(chunkSize);
      int nDecompressed = LZ4_decompress_safe(
          compressedPtr, outputPtr, chunkSize,
          int(std::min<size_t>(LZ4_MAX_INPUT_SIZE, maxOutputSize)));
      if (nDecompressed <= 0) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt? "
              "LZ4 error code: " +
              std::to_string(nDecompressed) + "\n";
        }
        return 0;
      }
      //std::cout << "nDecompressed = " << nDecompressed << "\n";
      if (nDecompressed > maxOutputSize) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt?\n";
        }
        return 0;
      }
      compressedPtr += chunkSize;
      outputPtr += nDecompressed;
      maxOutputSize -= size_t(nDecompressed);
      totalDecompressed += size_t(nDecompressed);
    }
    return totalDecompressed;
  }
  // unreachable.
}